

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O2

void leveldb::_Test_Varint32::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *limit;
  _Alloc_hider p;
  uint uStack_20c;
  int iStack_208;
  uint uStack_204;
  char *pcStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1f8;
  string sStack_1f0;
  Tester TStack_1d0;
  
  sStack_1f0._M_dataplus._M_p = (pointer)&sStack_1f0.field_2;
  sStack_1f0._M_string_length = 0;
  sStack_1f0.field_2._M_local_buf[0] = '\0';
  for (uVar2 = 0; uVar2 != 0x400; uVar2 = uVar2 + 1) {
    PutVarint32(&sStack_1f0,(uVar2 >> 5) << ((byte)uVar2 & 0x1f));
  }
  paStack_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_1f0._M_dataplus._M_p;
  limit = sStack_1f0._M_dataplus._M_p + sStack_1f0._M_string_length;
  p._M_p = sStack_1f0._M_dataplus._M_p;
  for (uVar2 = 0; uVar2 != 0x400; uVar2 = uVar2 + 1) {
    uStack_204 = (uVar2 >> 5) << ((byte)uVar2 & 0x1f);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)GetVarint32Ptr(p._M_p,limit,&uStack_20c);
    paStack_1f8 = paVar1;
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x5c);
    test::Tester::Is(&TStack_1d0,
                     paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0,"p != nullptr");
    test::Tester::~Tester(&TStack_1d0);
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x5d);
    test::Tester::IsEq<unsigned_int,unsigned_int>(&TStack_1d0,&uStack_204,&uStack_20c);
    test::Tester::~Tester(&TStack_1d0);
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x5e);
    iStack_208 = VarintLength((ulong)uStack_20c);
    pcStack_200 = paVar1->_M_local_buf + -(long)p._M_p;
    test::Tester::IsEq<int,long>(&TStack_1d0,&iStack_208,(long *)&pcStack_200);
    test::Tester::~Tester(&TStack_1d0);
    p._M_p = (pointer)paVar1;
  }
  test::Tester::Tester
            (&TStack_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x60);
  pcStack_200 = sStack_1f0._M_dataplus._M_p + sStack_1f0._M_string_length;
  test::Tester::IsEq<char_const*,char_const*>(&TStack_1d0,(char **)&paStack_1f8,&pcStack_200);
  test::Tester::~Tester(&TStack_1d0);
  std::__cxx11::string::~string((string *)&sStack_1f0);
  return;
}

Assistant:

TEST(Coding, Varint32) {
  std::string s;
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t v = (i / 32) << (i % 32);
    PutVarint32(&s, v);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t expected = (i / 32) << (i % 32);
    uint32_t actual;
    const char* start = p;
    p = GetVarint32Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(expected, actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, s.data() + s.size());
}